

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O0

bool ImGui_ImplSDL2_Init(SDL_Window *window,SDL_Renderer *renderer,void *sdl_gl_context)

{
  char *__s2;
  int iVar1;
  size_t __n;
  undefined8 *puVar2;
  ImGuiViewport *pIVar3;
  undefined8 in_RSI;
  void *in_RDI;
  SDL_SysWMinfo info;
  ImGuiViewport *main_viewport;
  ImGui_ImplSDL2_Data *bd;
  int n;
  char *global_mouse_whitelist [5];
  char *sdl_backend;
  bool mouse_can_use_global_state;
  ImGuiIO *io;
  ImGui_ImplSDL2_Data *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  undefined8 uVar4;
  size_t in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *__s1;
  undefined1 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff31;
  undefined1 in_stack_ffffffffffffff32;
  undefined5 in_stack_ffffffffffffff33;
  int local_5c;
  undefined8 local_58 [5];
  char *local_30;
  byte local_21;
  ImGuiIO *local_20;
  undefined8 local_10;
  void *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = ImGui::GetIO();
  ImGui::DebugCheckVersionAndDataLayout
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00,4,
             CONCAT53(in_stack_ffffffffffffff33,
                      CONCAT12(in_stack_ffffffffffffff32,
                               CONCAT11(in_stack_ffffffffffffff31,in_stack_ffffffffffffff30))));
  local_21 = 0;
  local_30 = (char *)SDL_GetCurrentVideoDriver();
  memcpy(local_58,&PTR_anon_var_dwarf_274bc7_00303c80,0x28);
  for (local_5c = 0; local_5c < 5; local_5c = local_5c + 1) {
    __s2 = (char *)local_58[local_5c];
    __s1 = local_30;
    __n = strlen((char *)local_58[local_5c]);
    iVar1 = strncmp(__s1,__s2,__n);
    if (iVar1 == 0) {
      local_21 = 1;
    }
  }
  uVar4 = 0x98;
  ImGui::MemAlloc((size_t)in_stack_ffffffffffffff00);
  puVar2 = (undefined8 *)operator_new(uVar4);
  ImGui_ImplSDL2_Data::ImGui_ImplSDL2_Data(in_stack_ffffffffffffff00);
  local_20->BackendPlatformUserData = puVar2;
  local_20->BackendPlatformName = "imgui_impl_sdl2";
  local_20->BackendFlags = local_20->BackendFlags | 2;
  local_20->BackendFlags = local_20->BackendFlags | 4;
  *puVar2 = local_8;
  puVar2[1] = local_10;
  *(byte *)((long)puVar2 + 0x7c) = local_21 & 1;
  local_20->SetClipboardTextFn = ImGui_ImplSDL2_SetClipboardText;
  local_20->GetClipboardTextFn = ImGui_ImplSDL2_GetClipboardText;
  local_20->ClipboardUserData = (void *)0x0;
  local_20->PlatformSetImeDataFn = ImGui_ImplSDL2_PlatformSetImeData;
  *(undefined4 *)(puVar2 + 0x12) = 0;
  *(undefined1 *)((long)puVar2 + 0x94) = 1;
  uVar4 = SDL_CreateSystemCursor(0);
  puVar2[5] = uVar4;
  uVar4 = SDL_CreateSystemCursor(1);
  puVar2[6] = uVar4;
  uVar4 = SDL_CreateSystemCursor(9);
  puVar2[7] = uVar4;
  uVar4 = SDL_CreateSystemCursor(8);
  puVar2[8] = uVar4;
  uVar4 = SDL_CreateSystemCursor(7);
  puVar2[9] = uVar4;
  uVar4 = SDL_CreateSystemCursor(6);
  puVar2[10] = uVar4;
  uVar4 = SDL_CreateSystemCursor(5);
  puVar2[0xb] = uVar4;
  uVar4 = SDL_CreateSystemCursor(0xb);
  puVar2[0xc] = uVar4;
  uVar4 = SDL_CreateSystemCursor(10);
  puVar2[0xd] = uVar4;
  pIVar3 = ImGui::GetMainViewport();
  pIVar3->PlatformHandle = local_8;
  pIVar3->PlatformHandleRaw = (void *)0x0;
  SDL_GetWindowWMInfo(local_8,&stack0xffffffffffffff30);
  SDL_SetHint("SDL_MOUSE_FOCUS_CLICKTHROUGH","1");
  SDL_SetHint("SDL_IME_SHOW_UI","1");
  return true;
}

Assistant:

static bool ImGui_ImplSDL2_Init(SDL_Window* window, SDL_Renderer* renderer, void* sdl_gl_context)
{
    ImGuiIO& io = ImGui::GetIO();
    IMGUI_CHECKVERSION();
    IM_ASSERT(io.BackendPlatformUserData == nullptr && "Already initialized a platform backend!");

    // Check and store if we are on a SDL backend that supports global mouse position
    // ("wayland" and "rpi" don't support it, but we chose to use a white-list instead of a black-list)
    bool mouse_can_use_global_state = false;
#if SDL_HAS_CAPTURE_AND_GLOBAL_MOUSE
    const char* sdl_backend = SDL_GetCurrentVideoDriver();
    const char* global_mouse_whitelist[] = { "windows", "cocoa", "x11", "DIVE", "VMAN" };
    for (int n = 0; n < IM_ARRAYSIZE(global_mouse_whitelist); n++)
        if (strncmp(sdl_backend, global_mouse_whitelist[n], strlen(global_mouse_whitelist[n])) == 0)
            mouse_can_use_global_state = true;
#endif

    // Setup backend capabilities flags
    ImGui_ImplSDL2_Data* bd = IM_NEW(ImGui_ImplSDL2_Data)();
    io.BackendPlatformUserData = (void*)bd;
    io.BackendPlatformName = "imgui_impl_sdl2";
    io.BackendFlags |= ImGuiBackendFlags_HasMouseCursors;       // We can honor GetMouseCursor() values (optional)
    io.BackendFlags |= ImGuiBackendFlags_HasSetMousePos;        // We can honor io.WantSetMousePos requests (optional, rarely used)

    bd->Window = window;
    bd->Renderer = renderer;
    bd->MouseCanUseGlobalState = mouse_can_use_global_state;

    io.SetClipboardTextFn = ImGui_ImplSDL2_SetClipboardText;
    io.GetClipboardTextFn = ImGui_ImplSDL2_GetClipboardText;
    io.ClipboardUserData = nullptr;
    io.PlatformSetImeDataFn = ImGui_ImplSDL2_PlatformSetImeData;
#ifdef __EMSCRIPTEN__
    io.PlatformOpenInShellFn = [](ImGuiContext*, const char* url) { ImGui_ImplSDL2_EmscriptenOpenURL(url); return true; };
#endif

    // Gamepad handling
    bd->GamepadMode = ImGui_ImplSDL2_GamepadMode_AutoFirst;
    bd->WantUpdateGamepadsList = true;

    // Load mouse cursors
    bd->MouseCursors[ImGuiMouseCursor_Arrow] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_ARROW);
    bd->MouseCursors[ImGuiMouseCursor_TextInput] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_IBEAM);
    bd->MouseCursors[ImGuiMouseCursor_ResizeAll] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZEALL);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNS] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZENS);
    bd->MouseCursors[ImGuiMouseCursor_ResizeEW] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZEWE);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNESW] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZENESW);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNWSE] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZENWSE);
    bd->MouseCursors[ImGuiMouseCursor_Hand] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_HAND);
    bd->MouseCursors[ImGuiMouseCursor_NotAllowed] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_NO);

    // Set platform dependent data in viewport
    // Our mouse update function expect PlatformHandle to be filled for the main viewport
    ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    main_viewport->PlatformHandle = (void*)window;
    main_viewport->PlatformHandleRaw = nullptr;
    SDL_SysWMinfo info;
    SDL_VERSION(&info.version);
    if (SDL_GetWindowWMInfo(window, &info))
    {
#if defined(SDL_VIDEO_DRIVER_WINDOWS)
        main_viewport->PlatformHandleRaw = (void*)info.info.win.window;
#elif defined(__APPLE__) && defined(SDL_VIDEO_DRIVER_COCOA)
        main_viewport->PlatformHandleRaw = (void*)info.info.cocoa.window;
#endif
    }

    // From 2.0.5: Set SDL hint to receive mouse click events on window focus, otherwise SDL doesn't emit the event.
    // Without this, when clicking to gain focus, our widgets wouldn't activate even though they showed as hovered.
    // (This is unfortunately a global SDL setting, so enabling it might have a side-effect on your application.
    // It is unlikely to make a difference, but if your app absolutely needs to ignore the initial on-focus click:
    // you can ignore SDL_MOUSEBUTTONDOWN events coming right after a SDL_WINDOWEVENT_FOCUS_GAINED)
#ifdef SDL_HINT_MOUSE_FOCUS_CLICKTHROUGH
    SDL_SetHint(SDL_HINT_MOUSE_FOCUS_CLICKTHROUGH, "1");
#endif

    // From 2.0.18: Enable native IME.
    // IMPORTANT: This is used at the time of SDL_CreateWindow() so this will only affects secondary windows, if any.
    // For the main window to be affected, your application needs to call this manually before calling SDL_CreateWindow().
#ifdef SDL_HINT_IME_SHOW_UI
    SDL_SetHint(SDL_HINT_IME_SHOW_UI, "1");
#endif

    // From 2.0.22: Disable auto-capture, this is preventing drag and drop across multiple windows (see #5710)
#ifdef SDL_HINT_MOUSE_AUTO_CAPTURE
    SDL_SetHint(SDL_HINT_MOUSE_AUTO_CAPTURE, "0");
#endif

    (void)sdl_gl_context; // Unused in 'master' branch.
    return true;
}